

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_ObjY(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  
  if (this->t_argc == 0) {
    pAVar2 = (this->Script->trigger).field_0.p;
    if ((pAVar2 != (AActor *)0x0) &&
       (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      pAVar2 = (AActor *)0x0;
    }
  }
  else {
    pAVar2 = actorvalue(this->t_argv);
  }
  if (pAVar2 == (AActor *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = (int)((pAVar2->__Pos).Y * 65536.0);
  }
  (this->t_return).value.i = iVar1;
  (this->t_return).type = 6;
  return;
}

Assistant:

void FParser::SF_ObjY(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.setDouble(mo ? mo->Y() : 0.);
}